

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

Error __thiscall
asmjit::X86RAPass::emitImmToReg(X86RAPass *this,uint32_t dstTypeId,uint32_t dstPhysId,Imm *src)

{
  ulong uVar1;
  undefined8 *in_RCX;
  Operand_ *o0;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  Imm imm;
  X86Reg r0;
  char *in_stack_00000270;
  int in_stack_0000027c;
  char *in_stack_00000280;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  uint32_t instId;
  undefined8 local_160;
  undefined8 local_158 [6];
  undefined8 *local_128;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined8 *local_f0;
  undefined1 *local_e8;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined8 *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 *local_60;
  undefined1 *local_50;
  ulong local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined8 *local_18;
  undefined8 *local_8;
  
  if (in_EDX == 0xff) {
    DebugUtils::assertionFailed(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
  }
  local_128 = &local_160;
  local_b4 = 0;
  local_b8 = 0;
  local_84 = 0;
  local_88 = 0;
  local_74 = 0;
  local_78 = 0;
  local_160 = 0;
  local_a4 = 0;
  local_a8 = 0;
  local_90 = local_158;
  local_94 = 0;
  local_98 = 0;
  local_6c = 0;
  local_70 = 0;
  local_158[0] = 0;
  local_118 = &stack0xfffffffffffffe90;
  uVar1 = in_RCX[1];
  o0 = (Operand_ *)(ulong)(in_ESI - 0x22U);
  if (in_ESI - 0x22U < 0x10 || in_ESI == 0x32) {
    instId = (uint32_t)((ulong)in_RDI >> 0x20);
    local_d0 = local_128;
    local_c8 = local_128;
    local_c0 = local_128;
    local_b0 = local_128;
    local_a0 = local_128;
    local_80 = local_128;
    local_60 = local_118;
    local_50 = local_118;
    switch((long)&switchD_0016474f::switchdataD_001d38f0 +
           (long)(int)(&switchD_0016474f::switchdataD_001d38f0)[(long)o0]) {
    case 0x164751:
      local_110 = &stack0xfffffffffffffe90;
    case 0x16476f:
      local_108 = &stack0xfffffffffffffe90;
    case 0x164793:
      break;
    case 0x164843:
      local_e8 = &stack0xfffffffffffffe90;
      in_stack_fffffffffffffe7f = uVar1 < 0x100000000;
      local_48 = uVar1;
      if (!(bool)in_stack_fffffffffffffe7f) {
        local_d8 = &local_160;
        local_3c = 0x8000031;
        local_160 = CONCAT44(in_EDX,0x8000031);
        local_38 = local_d8;
        local_18 = local_d8;
        CodeEmitter::emit((CodeEmitter *)*in_RCX,instId,o0,
                          (Operand_ *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78))
        ;
        return 0;
      }
      break;
    case 0x16492a:
      DebugUtils::assertionFailed(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
    case 0x164944:
      return 0;
    case 0x164946:
      goto switchD_0016474f_caseD_164946;
    }
    local_100 = &stack0xfffffffffffffe90;
    local_f0 = &local_160;
    local_2c = 0x4000029;
    local_160 = CONCAT44(in_EDX,0x4000029);
    local_28 = local_f0;
    local_8 = local_f0;
    CodeEmitter::emit((CodeEmitter *)*in_RCX,instId,o0,
                      (Operand_ *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  }
  else {
switchD_0016474f_caseD_164946:
  }
  return 0;
}

Assistant:

Error X86RAPass::emitImmToReg(uint32_t dstTypeId, uint32_t dstPhysId, const Imm* src) noexcept {
  ASMJIT_ASSERT(dstPhysId != Globals::kInvalidRegId);

  X86Reg r0;
  Imm imm(*src);

  switch (dstTypeId) {
    case TypeId::kI8:
    case TypeId::kU8:
      imm.truncateTo8Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI16:
    case TypeId::kU16:
      imm.truncateTo16Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
Mov32Truncate:
      imm.truncateTo32Bits();
      r0.setX86RegT<X86Reg::kRegGpd>(dstPhysId);
      cc()->emit(X86Inst::kIdMov, r0, imm);
      break;

    case TypeId::kI64:
    case TypeId::kU64:
      // Move to GPD register will also clear the high DWORD of GPQ
      // register in 64-bit mode.
      if (imm.isUInt32())
        goto Mov32Truncate;

      r0.setX86RegT<X86Reg::kRegGpq>(dstPhysId);
      cc()->emit(X86Inst::kIdMov, r0, imm);
      break;

    case TypeId::kF32:
    case TypeId::kF64:
      // Compiler doesn't manage FPU stack.
      ASMJIT_NOT_REACHED();
      break;

    case TypeId::kMmx32:
    case TypeId::kMmx64:
      // TODO: [COMPILER] EmitMoveImmToReg.
      break;

    default:
      // TODO: [COMPILER] EmitMoveImmToReg.
      break;
  }

  return kErrorOk;
}